

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O2

void ipcmd_close(ipcmd_t *ipcmd)

{
  if (ipcmd != (ipcmd_t *)0x0) {
    if (ipcmd->type == IPCMD_TCP) {
      shutdown(ipcmd->socket,2);
    }
    else if (ipcmd->type == IPCMD_MSQ) {
      msgctl(ipcmd->socket,0,(msqid_ds *)0x0);
    }
    ipcmd->send = ipcmd_send;
    ipcmd->recv = ipcmd_recv;
    ipcmd->flush = ipcmd_flush;
  }
  return;
}

Assistant:

void ipcmd_close(struct ipcmd_t* ipcmd)
{
  if (ipcmd == NULL)
    return;
  switch (ipcmd->type)
  {
    case IPCMD_MSQ:
      msgctl(ipcmd->socket, IPC_RMID, NULL);
      break;
    case IPCMD_TCP:
      shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
#if HAVE_LIBWS2_32
      WSACleanup();
#endif  // HAVE_LIBWS2_32
      break;
  }
  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
}